

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

ON_SumSurface * __thiscall
ON_Extrusion::SumSurfaceForm(ON_Extrusion *this,ON_SumSurface *sum_surface)

{
  ON_Interval domain;
  ON_Interval domain_00;
  ON_Curve *pOVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ON_LineCurve *pOVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar6;
  double dVar7;
  double in_XMM1_Qa;
  ON_Extrusion *local_200;
  ON_BoundingBox local_1a0;
  undefined1 local_159;
  ON_Extrusion *local_158;
  ON_Extrusion *local_150;
  ON_SumSurface *sumsrf;
  ON_3dPoint local_120;
  ON_3dPoint local_108;
  ON_LineCurve *local_f0;
  ON_LineCurve *line_curve;
  ON_Curve *local_d8;
  ON_Curve *segment;
  ON_PolyCurve *polycurve;
  ON_Curve *curve1;
  ON_Curve *curve0;
  ON_LineCurve *path;
  ON_Curve *profile3d;
  ON_Xform xform0;
  int i;
  ON_SumSurface *sum_surface_local;
  ON_Extrusion *this_local;
  
  if (sum_surface != (ON_SumSurface *)0x0) {
    for (xform0.m_xform[3][3]._4_4_ = 0; xform0.m_xform[3][3]._4_4_ < 2;
        xform0.m_xform[3][3]._4_4_ = xform0.m_xform[3][3]._4_4_ + 1) {
      if (sum_surface->m_curve[xform0.m_xform[3][3]._4_4_] != (ON_Curve *)0x0) {
        if (sum_surface->m_curve[xform0.m_xform[3][3]._4_4_] != (ON_Curve *)0x0) {
          (*(sum_surface->m_curve[xform0.m_xform[3][3]._4_4_]->super_ON_Geometry).super_ON_Object.
            _vptr_ON_Object[4])();
        }
        sum_surface->m_curve[xform0.m_xform[3][3]._4_4_] = (ON_Curve *)0x0;
      }
      (sum_surface->m_basepoint).x = ON_3dVector::ZeroVector.x;
      (sum_surface->m_basepoint).y = ON_3dVector::ZeroVector.y;
      (sum_surface->m_basepoint).z = ON_3dVector::ZeroVector.z;
      ON_BoundingBox::Destroy(&sum_surface->m_bbox);
    }
  }
  if ((this->m_profile == (ON_Curve *)0x0) || (bVar2 = ON_Line::IsValid(&this->m_path), !bVar2)) {
    return (ON_SumSurface *)(ON_Extrusion *)0x0;
  }
  iVar3 = IsMitered(this);
  if (iVar3 != 0) {
    return (ON_SumSurface *)(ON_Extrusion *)0x0;
  }
  ON_Xform::ON_Xform((ON_Xform *)&profile3d);
  bVar2 = GetProfileTransformation(this,0.0,(ON_Xform *)&profile3d);
  if (!bVar2) {
    return (ON_SumSurface *)(ON_Extrusion *)0x0;
  }
  path = (ON_LineCurve *)0x0;
  curve0 = (ON_Curve *)0x0;
  curve1 = (ON_Curve *)0x0;
  polycurve = (ON_PolyCurve *)0x0;
  iVar3 = ProfileCount(this);
  if ((((iVar3 == 1) &&
       (segment = &ON_PolyCurve::Cast((ON_Object *)this->m_profile)->super_ON_Curve,
       (ON_PolyCurve *)segment != (ON_PolyCurve *)0x0)) &&
      (iVar3 = ON_PolyCurve::Count((ON_PolyCurve *)segment), iVar3 == 1)) &&
     (local_d8 = ON_PolyCurve::SegmentCurve((ON_PolyCurve *)segment,0), local_d8 != (ON_Curve *)0x0)
     ) {
    iVar3 = (*(local_d8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
    path = (ON_LineCurve *)CONCAT44(extraout_var,iVar3);
    (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
    domain_00.m_t[1] = in_XMM1_Qa;
    domain_00.m_t[0] = extraout_XMM0_Qa;
    ON_Curve::SetDomain((ON_Curve *)CONCAT44(extraout_var,iVar3),domain_00);
  }
  if (path == (ON_LineCurve *)0x0) {
    iVar3 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
    path = (ON_LineCurve *)CONCAT44(extraout_var_00,iVar3);
    if (path == (ON_LineCurve *)0x0) goto LAB_004f7380;
  }
  uVar4 = (*(path->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2e])
                    (0x3df0000000000000);
  if (((uVar4 & 1) != 0) &&
     (pOVar5 = ON_LineCurve::Cast((ON_Object *)path), pOVar5 == (ON_LineCurve *)0x0)) {
    pOVar5 = (ON_LineCurve *)operator_new(0x58);
    ON_LineCurve::ON_LineCurve(pOVar5);
    local_f0 = pOVar5;
    ON_Curve::PointAtStart(&local_108,&path->super_ON_Curve);
    (local_f0->m_line).from.x = local_108.x;
    (local_f0->m_line).from.y = local_108.y;
    (local_f0->m_line).from.z = local_108.z;
    ON_Curve::PointAtEnd(&local_120,&path->super_ON_Curve);
    pOVar5 = local_f0;
    (local_f0->m_line).to.x = local_120.x;
    (local_f0->m_line).to.y = local_120.y;
    (local_f0->m_line).to.z = local_120.z;
    (*(path->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
    domain.m_t[1] = in_XMM1_Qa;
    domain.m_t[0] = extraout_XMM0_Qa_00;
    ON_Curve::SetDomain(&pOVar5->super_ON_Curve,domain);
    if (path != (ON_LineCurve *)0x0) {
      (*(path->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
    }
    path = local_f0;
  }
  uVar4 = (*(path->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x28])(path,3);
  if (((uVar4 & 1) != 0) &&
     ((bVar2 = ON_Xform::IsIdentity((ON_Xform *)&profile3d,0.0), bVar2 ||
      (uVar4 = (*(path->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x1c])
                         (path,&profile3d), (uVar4 & 1) != 0)))) {
    pOVar5 = (ON_LineCurve *)operator_new(0x58);
    ON_LineCurve::ON_LineCurve(pOVar5);
    curve0 = (ON_Curve *)pOVar5;
    if (pOVar5 != (ON_LineCurve *)0x0) {
      (pOVar5->m_line).from.x = ON_3dPoint::Origin.x;
      (pOVar5->m_line).from.y = ON_3dPoint::Origin.y;
      (pOVar5->m_line).from.z = ON_3dPoint::Origin.z;
      ON_3dPoint::operator-((ON_3dVector *)&sumsrf,&(this->m_path).to,&(this->m_path).from);
      ON_3dPoint::operator=
                ((ON_3dPoint *)&curve0[2].super_ON_Geometry.super_ON_Object.m_userdata_list,
                 (ON_3dVector *)&sumsrf);
      pOVar1 = curve0;
      dVar6 = ON_Interval::operator[](&this->m_path_domain,0);
      dVar7 = ON_Interval::operator[](&this->m_path_domain,1);
      uVar4 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(dVar6,dVar7);
      if ((uVar4 & 1) != 0) {
        curve1 = &path->super_ON_Curve;
        polycurve = (ON_PolyCurve *)curve0;
        path = (ON_LineCurve *)0x0;
        curve0 = (ON_Curve *)0x0;
      }
    }
  }
LAB_004f7380:
  if ((curve1 == (ON_Curve *)0x0) || (polycurve == (ON_PolyCurve *)0x0)) {
    if ((path != (ON_LineCurve *)0x0) && (path != (ON_LineCurve *)0x0)) {
      (*(path->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
    }
    if ((curve0 != (ON_Curve *)0x0) && (curve0 != (ON_Curve *)0x0)) {
      (*(curve0->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    }
    this_local = (ON_Extrusion *)0x0;
  }
  else {
    local_159 = 0;
    local_200 = (ON_Extrusion *)sum_surface;
    if (sum_surface == (ON_SumSurface *)0x0) {
      local_200 = (ON_Extrusion *)operator_new(0x68);
      local_159 = 1;
      local_158 = local_200;
      ON_SumSurface::ON_SumSurface((ON_SumSurface *)local_200);
    }
    local_150 = local_200;
    if (local_200 == (ON_Extrusion *)0x0) {
      if (curve1 != (ON_Curve *)0x0) {
        (*(curve1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
      }
      if (polycurve != (ON_PolyCurve *)0x0) {
        (*(polycurve->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
      }
      this_local = (ON_Extrusion *)0x0;
    }
    else {
      (local_200->m_path).from.x = (double)curve1;
      (local_200->m_path).from.y = (double)polycurve;
      ((ON_3dVector *)&(local_200->m_path).from.z)->x = ON_3dVector::ZeroVector.x;
      (local_200->m_path).to.x = ON_3dVector::ZeroVector.y;
      (local_200->m_path).to.y = ON_3dVector::ZeroVector.z;
      ON_Geometry::BoundingBox(&local_1a0,(ON_Geometry *)this);
      memcpy(&(local_150->m_path).to.z,&local_1a0,0x30);
      if ((this->m_bTransposed & 1U) != 0) {
        (*(local_150->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x36])();
      }
      this_local = local_150;
    }
  }
  return (ON_SumSurface *)this_local;
}

Assistant:

ON_SumSurface* ON_Extrusion::SumSurfaceForm( 
  ON_SumSurface* sum_surface 
  ) const
{
  int i;
  if ( 0 != sum_surface )
  {
    for ( i = 0; i < 2; i++ )
    {
      if ( sum_surface->m_curve[i] )
      {
        delete sum_surface->m_curve[i];
        sum_surface->m_curve[i] = 0;
      }
      sum_surface->m_basepoint = ON_3dVector::ZeroVector;
      sum_surface->m_bbox.Destroy();
    }
  }

  if ( 0 == m_profile || !m_path.IsValid() )
    return 0;

  if ( IsMitered() )
    return 0; // mitered extrusions cannot be represented as sum surfaces

  ON_Xform xform0;
  if ( !GetProfileTransformation(0.0,xform0) )
    return 0;

  ON_Curve* profile3d = 0;
  ON_LineCurve* path = 0;
  ON_Curve* curve0 = 0;
  ON_Curve* curve1 = 0;
  for(;;)
  {
    if ( 1 == ProfileCount() )
    {
      const ON_PolyCurve* polycurve = ON_PolyCurve::Cast(m_profile);
      if ( 0 != polycurve && 1 == polycurve->Count() )
      {
        const ON_Curve* segment = polycurve->SegmentCurve(0);
        if ( 0 != segment )
        {
          profile3d = segment->DuplicateCurve();
          profile3d->SetDomain( m_profile->Domain() );
        }
      }
    }
    if ( 0 == profile3d )
    {
      profile3d = m_profile->DuplicateCurve();
      if ( 0 == profile3d )
        break;
    }
    if ( profile3d->IsLinear() && 0 == ON_LineCurve::Cast(profile3d) )
    {
      ON_LineCurve* line_curve = new ON_LineCurve();
      line_curve->m_line.from = profile3d->PointAtStart();
      line_curve->m_line.to = profile3d->PointAtEnd();
      line_curve->ON_Curve::SetDomain(profile3d->Domain());
      delete profile3d;
      profile3d = line_curve;
    }
    if ( !profile3d->ChangeDimension(3) )
      break;
    if ( !xform0.IsIdentity() && !profile3d->Transform(xform0) )
      break;

    path = new ON_LineCurve();
    if ( 0 == path )
      break;
    path->m_line.from = ON_3dPoint::Origin;
    path->m_line.to = (m_path.to - m_path.from);
    if ( !path->SetDomain( m_path_domain[0], m_path_domain[1] ) )
      break;

    curve0 = profile3d;
    curve1 = path;
    profile3d = 0;
    path = 0;
    break;
  }
  if ( 0 == curve0 || 0 == curve1 )
  {
    if ( 0 != profile3d )
      delete profile3d;
    if ( 0 != path )
      delete path;
    return 0;
  }

  ON_SumSurface* sumsrf = ( 0 != sum_surface ) ? sum_surface : new ON_SumSurface();
  if ( 0 == sumsrf )
  {
    delete curve0;
    delete curve1;
    return 0;
  }

  sumsrf->m_curve[0] = curve0;
  sumsrf->m_curve[1] = curve1;
  sumsrf->m_basepoint = ON_3dVector::ZeroVector;
  sumsrf->m_bbox = BoundingBox();

  if ( m_bTransposed )
    sumsrf->Transpose();

  return sumsrf;
}